

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O0

object * item_menu(cmd_code cmd,wchar_t prompt_size,wchar_t mode)

{
  size_t sVar1;
  _Bool _Var2;
  char cVar3;
  void *pvVar4;
  size_t sVar5;
  bool bVar6;
  ui_event uVar7;
  wchar_t local_c0;
  wchar_t local_b8;
  wchar_t local_a8;
  wchar_t local_9c;
  size_t local_98;
  _Bool left;
  ui_event_type local_80;
  wchar_t local_6c;
  object *poStack_68;
  wchar_t i;
  object *obj;
  wchar_t inscrip;
  wchar_t row;
  wchar_t ex_offset_ctr;
  ui_event evt;
  menu_conflict2 *m;
  menu_iter menu_f;
  wchar_t mode_local;
  wchar_t prompt_size_local;
  cmd_code cmd_local;
  
  menu_f.resize._4_4_ = mode;
  memcpy(&m,&PTR_get_item_tag_002f4548,0x28);
  evt._4_8_ = menu_new(MN_SKIN_OBJECT,(menu_iter *)&m);
  _row = (mouseclick)0x0;
  evt.type = EVT_NONE;
  inscrip = L'\0';
  poStack_68 = (object *)0x0;
  menu_setpriv((menu_conflict *)evt._4_8_,num_obj,items);
  if (player->upkeep->command_wrk == L'\b') {
    *(char **)(evt._4_8_ + 0x18) = "0123456789";
  }
  else {
    *(char **)(evt._4_8_ + 0x18) = "abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ";
  }
  *(char **)(evt._4_8_ + 0x30) = "/|-";
  *(code **)(evt._4_8_ + 0x48) = use_context_menu_list_switcher;
  *(undefined4 *)(evt._4_8_ + 0x50) = 0x44;
  *(code **)(evt._4_8_ + 0x38) = item_menu_browser;
  pvVar4 = mem_zalloc(10);
  *(void **)(evt._4_8_ + 0x20) = pvVar4;
  for (obj._0_4_ = 0; (int)obj < 10; obj._0_4_ = (int)obj + 1) {
    _Var2 = get_tag(&stack0xffffffffffffff98,(char)(int)obj + '0',item_cmd,(item_mode & 0x200U) != 0
                   );
    if (_Var2) {
      local_6c = L'\0';
      while ((local_6c < num_obj && (items[local_6c].object != poStack_68))) {
        local_6c = local_6c + L'\x01';
      }
      if (local_6c < num_obj) {
        cVar3 = get_item_tag((menu_conflict2 *)evt._4_8_,local_6c);
        *(char *)(*(long *)(evt._4_8_ + 0x20) + (long)(int)obj) = cVar3;
      }
    }
  }
  selection = (object *)0x0;
  set_obj_names(false,player);
  if (((menu_f.resize._4_4_ & 2U) != 0) && (*player->upkeep->quiver != (object *)0x0)) {
    if (max_len < 0x18) {
      local_98 = 0x18;
    }
    else {
      local_98 = max_len;
    }
    max_len = local_98;
  }
  if ((olist_mode & OLIST_WEIGHT) != OLIST_NONE) {
    ex_width = ex_width + L'\t';
    inscrip = inscrip + L'\t';
  }
  if ((olist_mode & OLIST_PRICE) != OLIST_NONE) {
    ex_width = ex_width + L'\t';
    inscrip = inscrip + L'\t';
  }
  if ((olist_mode & OLIST_FAIL) != OLIST_NONE) {
    ex_width = ex_width + L'\n';
    inscrip = inscrip + L'\n';
  }
  area.page_rows = *(wchar_t *)(evt._4_8_ + 0x70);
  area.row = L'\x01';
  local_a8 = (wchar_t)max_len;
  if (prompt_size + L'\xfffffffe' < ((Term->wid + -1) - local_a8) - ex_width) {
    local_9c = prompt_size + L'\xfffffffe';
  }
  else {
    local_9c = ((Term->wid + -1) - local_a8) - ex_width;
  }
  area.col = local_9c;
  if (local_9c < L'\x04') {
    area.col = L'\0';
  }
  if ((ulong)(long)(((Term->wid + -1) - ex_width) - area.col) < max_len) {
    local_a8 = ((Term->wid + -1) - ex_width) - area.col;
  }
  ex_offset = local_a8;
  do {
    sVar5 = strlen(header);
    if (max_len + (long)ex_width + (long)inscrip <= sVar5) break;
    my_strcat(header," ",0x50);
    sVar5 = strlen(header);
  } while (sVar5 < 0x4f);
  sVar1 = max_len;
  sVar5 = strlen(header);
  if (sVar1 < sVar5) {
    sVar5 = strlen(header);
    local_b8 = (wchar_t)sVar5;
  }
  else {
    local_b8 = (wchar_t)max_len;
  }
  area.width = local_b8;
  for (obj._4_4_ = area.row; obj._4_4_ < area.row + area.page_rows; obj._4_4_ = obj._4_4_ + L'\x01')
  {
    if (area.col + L'\xffffffff' < 1) {
      local_c0 = L'\0';
    }
    else {
      local_c0 = area.col + L'\xffffffff';
    }
    prt("",obj._4_4_,local_c0);
  }
  menu_layout((menu_conflict *)evt._4_8_,(region_conflict *)&area);
  uVar7 = menu_select((menu_conflict *)evt._4_8_,0,true);
  _row = uVar7.mouse;
  local_80 = CONCAT31(local_80._1_3_,uVar7.key.mods);
  evt.type = local_80;
  mem_free(*(void **)(evt._4_8_ + 0x20));
  mem_free((void *)evt._4_8_);
  if ((row == L'\x80') && ((newmenu & 1U) == 0)) {
    bVar6 = ex_offset_ctr != L'\x81';
    if (player->upkeep->command_wrk == L'\x01') {
      if (bVar6) {
        if (i2 < i1) {
          if (q2 < q1) {
            if (f1 <= f2) {
              player->upkeep->command_wrk = L'\x04';
            }
          }
          else {
            player->upkeep->command_wrk = L'\b';
          }
        }
        else {
          player->upkeep->command_wrk = L'\x02';
        }
      }
      else if (f2 < f1) {
        if (q2 < q1) {
          if (i1 <= i2) {
            player->upkeep->command_wrk = L'\x02';
          }
        }
        else {
          player->upkeep->command_wrk = L'\b';
        }
      }
      else {
        player->upkeep->command_wrk = L'\x04';
      }
    }
    else if (player->upkeep->command_wrk == L'\x02') {
      if (bVar6) {
        if (q2 < q1) {
          if (f2 < f1) {
            if (e1 <= e2) {
              player->upkeep->command_wrk = L'\x01';
            }
          }
          else {
            player->upkeep->command_wrk = L'\x04';
          }
        }
        else {
          player->upkeep->command_wrk = L'\b';
        }
      }
      else if (e2 < e1) {
        if (f2 < f1) {
          if (q1 <= q2) {
            player->upkeep->command_wrk = L'\b';
          }
        }
        else {
          player->upkeep->command_wrk = L'\x04';
        }
      }
      else {
        player->upkeep->command_wrk = L'\x01';
      }
    }
    else if (player->upkeep->command_wrk == L'\b') {
      if (bVar6) {
        if (f2 < f1) {
          if (e2 < e1) {
            if (i1 <= i2) {
              player->upkeep->command_wrk = L'\x02';
            }
          }
          else {
            player->upkeep->command_wrk = L'\x01';
          }
        }
        else {
          player->upkeep->command_wrk = L'\x04';
        }
      }
      else if (i2 < i1) {
        if (e2 < e1) {
          if (f1 <= f2) {
            player->upkeep->command_wrk = L'\x04';
          }
        }
        else {
          player->upkeep->command_wrk = L'\x01';
        }
      }
      else {
        player->upkeep->command_wrk = L'\x02';
      }
    }
    else if (player->upkeep->command_wrk == L'\x04') {
      if (bVar6) {
        if (e2 < e1) {
          if (i2 < i1) {
            if (q1 <= q2) {
              player->upkeep->command_wrk = L'\b';
            }
          }
          else {
            player->upkeep->command_wrk = L'\x02';
          }
        }
        else {
          player->upkeep->command_wrk = L'\x01';
        }
      }
      else if (q2 < q1) {
        if (i2 < i1) {
          if (e1 <= e2) {
            player->upkeep->command_wrk = L'\x01';
          }
        }
        else {
          player->upkeep->command_wrk = L'\x02';
        }
      }
      else {
        player->upkeep->command_wrk = L'\b';
      }
    }
    else if (player->upkeep->command_wrk == L'ࠀ') {
      if (bVar6) {
        if (e2 < e1) {
          if (i2 < i1) {
            if (q1 <= q2) {
              player->upkeep->command_wrk = L'\b';
            }
          }
          else {
            player->upkeep->command_wrk = L'\x02';
          }
        }
        else {
          player->upkeep->command_wrk = L'\x01';
        }
      }
      else if (q2 < q1) {
        if (i2 < i1) {
          if (e1 <= e2) {
            player->upkeep->command_wrk = L'\x01';
          }
        }
        else {
          player->upkeep->command_wrk = L'\x02';
        }
      }
      else {
        player->upkeep->command_wrk = L'\b';
      }
    }
    newmenu = true;
  }
  return selection;
}

Assistant:

static struct object *item_menu(cmd_code cmd, int prompt_size, int mode)
{
	menu_iter menu_f = { get_item_tag, get_item_validity, get_item_display,
						 get_item_action, 0 };
	struct menu *m = menu_new(MN_SKIN_OBJECT, &menu_f);
	ui_event evt = { 0 };
	int ex_offset_ctr = 0;
	int row, inscrip;
	struct object *obj = NULL;

	/* Set up the menu */
	menu_setpriv(m, num_obj, items);
	if (player->upkeep->command_wrk == USE_QUIVER)
		m->selections = "0123456789";
	else
		m->selections = all_letters_nohjkl;
	m->switch_keys = "/|-";
	m->context_hook = use_context_menu_list_switcher;
	m->flags = (MN_PVT_TAGS | MN_INSCRIP_TAGS);
	m->browse_hook = item_menu_browser;

	/* Get inscriptions */
	m->inscriptions = mem_zalloc(10 * sizeof(char));
	for (inscrip = 0; inscrip < 10; inscrip++) {
		/* Look up the tag */
		if (get_tag(&obj, (char)inscrip + '0', item_cmd,
					item_mode & QUIVER_TAGS)) {
			int i;
			for (i = 0; i < num_obj; i++)
				if (items[i].object == obj)
						break;

			if (i < num_obj)
				m->inscriptions[inscrip] = get_item_tag(m, i);
		}
	}

	/* Set up the item list variables */
	selection = NULL;
	set_obj_names(false, player);

	if (mode & OLIST_QUIVER && player->upkeep->quiver[0] != NULL)
		max_len = MAX(max_len, 24);

	if (olist_mode & OLIST_WEIGHT) {
		ex_width += 9;
		ex_offset_ctr += 9;
	}
	if (olist_mode & OLIST_PRICE) {
		ex_width += 9;
		ex_offset_ctr += 9;
	}
	if (olist_mode & OLIST_FAIL) {
		ex_width += 10;
		ex_offset_ctr += 10;
	}

	/* Set up the menu region */
	area.page_rows = m->count;
	area.row = 1;
	area.col = MIN(Term->wid - 1 - (int) max_len - ex_width, prompt_size - 2);
	if (area.col <= 3)
		area.col = 0;
	ex_offset = MIN(max_len, (size_t)(Term->wid - 1 - ex_width - area.col));
	while (strlen(header) < max_len + ex_width + ex_offset_ctr) {
		my_strcat(header, " ", sizeof(header));
		if (strlen(header) > sizeof(header) - 2) break;
	}
	area.width = MAX(max_len, strlen(header));

	for (row = area.row; row < area.row + area.page_rows; row++)
		prt("", row, MAX(0, area.col - 1));

	menu_layout(m, &area);

	/* Choose */
	evt = menu_select(m, 0, true);

	/* Clean up */
	mem_free(m->inscriptions);
	mem_free(m);

	/* Deal with menu switch */
	if (evt.type == EVT_SWITCH && !newmenu) {
		bool left = evt.key.code == ARROW_LEFT;

		if (player->upkeep->command_wrk == USE_EQUIP) {
			if (left) {
				if (f1 <= f2) player->upkeep->command_wrk = USE_FLOOR;
				else if (q1 <= q2) player->upkeep->command_wrk = USE_QUIVER;
				else if (i1 <= i2) player->upkeep->command_wrk = USE_INVEN;
			} else {
				if (i1 <= i2) player->upkeep->command_wrk = USE_INVEN;
				else if (q1 <= q2) player->upkeep->command_wrk = USE_QUIVER;
				else if (f1 <= f2) player->upkeep->command_wrk = USE_FLOOR;
			}
		} else if (player->upkeep->command_wrk == USE_INVEN) {
			if (left) {
				if (e1 <= e2) player->upkeep->command_wrk = USE_EQUIP;
				else if (f1 <= f2) player->upkeep->command_wrk = USE_FLOOR;
				else if (q1 <= q2) player->upkeep->command_wrk = USE_QUIVER;
			} else {
				if (q1 <= q2) player->upkeep->command_wrk = USE_QUIVER;
				else if (f1 <= f2) player->upkeep->command_wrk = USE_FLOOR;
				else if (e1 <= e2) player->upkeep->command_wrk = USE_EQUIP;
			}
		} else if (player->upkeep->command_wrk == USE_QUIVER) {
			if (left) {
				if (i1 <= i2) player->upkeep->command_wrk = USE_INVEN;
				else if (e1 <= e2) player->upkeep->command_wrk = USE_EQUIP;
				else if (f1 <= f2) player->upkeep->command_wrk = USE_FLOOR;
			} else {
				if (f1 <= f2) player->upkeep->command_wrk = USE_FLOOR;
				else if (e1 <= e2) player->upkeep->command_wrk = USE_EQUIP;
				else if (i1 <= i2) player->upkeep->command_wrk = USE_INVEN;
			}
		} else if (player->upkeep->command_wrk == USE_FLOOR) {
			if (left) {
				if (q1 <= q2) player->upkeep->command_wrk = USE_QUIVER;
				else if (i1 <= i2) player->upkeep->command_wrk = USE_INVEN;
				else if (e1 <= e2) player->upkeep->command_wrk = USE_EQUIP;
			} else {
				if (e1 <= e2) player->upkeep->command_wrk = USE_EQUIP;
				else if (i1 <= i2) player->upkeep->command_wrk = USE_INVEN;
				else if (q1 <= q2) player->upkeep->command_wrk = USE_QUIVER;
			}
		} else if (player->upkeep->command_wrk == SHOW_THROWING) {
			if (left) {
				if (q1 <= q2) player->upkeep->command_wrk = USE_QUIVER;
				else if (i1 <= i2) player->upkeep->command_wrk = USE_INVEN;
				else if (e1 <= e2) player->upkeep->command_wrk = USE_EQUIP;
			} else {
				if (e1 <= e2) player->upkeep->command_wrk = USE_EQUIP;
				else if (i1 <= i2) player->upkeep->command_wrk = USE_INVEN;
				else if (q1 <= q2) player->upkeep->command_wrk = USE_QUIVER;
			}
		}

		newmenu = true;
	}

	/* Result */
	return selection;
}